

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.c
# Opt level: O1

int compressor_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  undefined4 uVar2;
  
  if (field - 0x29 < 0xc) {
    pvVar1 = segment->data;
    switch(field) {
    case 0x29:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x34);
      break;
    default:
switchD_00137dd8_caseD_2a:
      mixed_err(7);
      return 0;
    case 0x2c:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x1078);
      break;
    case 0x2d:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x18);
      break;
    case 0x2e:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x1c);
      break;
    case 0x2f:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x107c);
      break;
    case 0x30:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x1080);
      break;
    case 0x31:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x1084);
      break;
    case 0x32:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x1088);
      break;
    case 0x33:
      *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 0x108c);
      *(undefined4 *)((long)value + 4) = *(undefined4 *)((long)pvVar1 + 0x1090);
      *(undefined4 *)((long)value + 8) = *(undefined4 *)((long)pvVar1 + 0x1094);
      *(undefined4 *)((long)value + 0xc) = *(undefined4 *)((long)pvVar1 + 0x1098);
      return 1;
    case 0x34:
      uVar2 = *(undefined4 *)((long)pvVar1 + 0x109c);
    }
    *(undefined4 *)value = uVar2;
  }
  else {
    if (field != 1) goto switchD_00137dd8_caseD_2a;
    *(bool *)value = segment->mix == compressor_segment_mix_bypass;
  }
  return 1;
}

Assistant:

int compressor_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct compressor_segment_data *data = (struct compressor_segment_data *)segment->data;
  switch(field){
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == compressor_segment_mix_bypass); break;
  case MIXED_COMPRESSOR_PREGAIN: *((float *)value) = data->pregain; break;
  case MIXED_COMPRESSOR_THRESHOLD: *((float *)value) = data->threshold; break;
  case MIXED_COMPRESSOR_KNEE: *((float *)value) = data->knee; break;
  case MIXED_COMPRESSOR_RATIO: *((float *)value) = data->ratio; break;
  case MIXED_COMPRESSOR_ATTACK: *((float *)value) = data->attack; break;
  case MIXED_COMPRESSOR_RELEASE: *((float *)value) = data->release; break;
  case MIXED_COMPRESSOR_PREDELAY: *((float *)value) = data->predelay; break;
  case MIXED_COMPRESSOR_POSTGAIN: *((float *)value) = data->postgain; break;
  case MIXED_MIX: *((float *)value) = data->wet; break;
  case MIXED_COMPRESSOR_RELEASEZONE: {
    float *zone = (float *)value;
    zone[0] = data->releasezone[0];
    zone[1] = data->releasezone[1];
    zone[2] = data->releasezone[2];
    zone[3] = data->releasezone[3];
  } break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}